

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
Parser_connectionVariable1Missing_Test::~Parser_connectionVariable1Missing_Test
          (Parser_connectionVariable1Missing_Test *this)

{
  Parser_connectionVariable1Missing_Test *this_local;
  
  ~Parser_connectionVariable1Missing_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, connectionVariable1Missing)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model name=\"\" xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"component_bob\">\n"
        "    <variable name=\"variable_bob\" units=\"scrat\"/>\n"
        "  </component>\n"
        "  <component name=\"component_dave\">\n"
        "    <variable name=\"variable_dave\" units=\"gone\"/>\n"
        "  </component>\n"
        "  <connection component_2=\"component_dave\" component_1=\"component_bob\">\n"
        "    <map_variables variable_2=\"variable_dave\"/>\n"
        "  </connection>\n"
        "</model>\n";
    const std::vector<std::string> expectedIssues = {
        "Connection in model '' does not specify a variable_1 in a map_variables element.",
        "Model does not contain the units 'scrat' required by variable 'variable_bob' in component 'component_bob'.",
        "Model does not contain the units 'gone' required by variable 'variable_dave' in component 'component_dave'.",
    };

    // Parse
    libcellml::ParserPtr p = libcellml::Parser::create();
    p->parseModel(e);
    EXPECT_EQ_ISSUES(expectedIssues, p);
}